

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_move.c
# Opt level: O3

void check_waterbreath(CHAR_DATA *ch,ROOM_INDEX_DATA *to_room)

{
  bool bVar1;
  AFFECT_DATA af;
  AFFECT_DATA local_80;
  
  bVar1 = is_affected(ch,(int)gsn_drowning);
  if ((((!bVar1) && (to_room->sector_type == 8)) &&
      (bVar1 = is_affected_room(to_room,(int)gsn_airy_water), !bVar1)) &&
     ((bVar1 = is_immortal(ch), !bVar1 && (bVar1 = is_heroimm(ch), !bVar1)))) {
    init_affect(&local_80);
    local_80.where = 0;
    local_80.aftype = 5;
    local_80.type = gsn_drowning;
    local_80.level = 0x3c;
    local_80.duration = 5;
    local_80.tick_fun = drowning_tick;
    new_affect_to_char(ch,&local_80);
    act("You take a deep breath and hold it tight as you descend into the water.",ch,(void *)0x0,
        (void *)0x0,3);
    act("$n takes a deep breath as $e descends into the water.",ch,(void *)0x0,(void *)0x0,0);
    return;
  }
  bVar1 = is_affected(ch,(int)gsn_drowning);
  if (!bVar1) {
    return;
  }
  if ((to_room->sector_type == 8) && (bVar1 = is_affected_room(to_room,(int)gsn_airy_water), !bVar1)
     ) {
    return;
  }
  switchD_002dea30::default(ch,(int)gsn_drowning);
  return;
}

Assistant:

void check_waterbreath(CHAR_DATA *ch, ROOM_INDEX_DATA *to_room)
{
	if (!is_affected(ch, gsn_drowning)
		&& to_room->sector_type == SECT_UNDERWATER
		&& !is_affected_room(to_room, gsn_airy_water)
		&& !is_immortal(ch)
		&& !is_heroimm(ch))
	{
		AFFECT_DATA af;
		init_affect(&af);
		af.where = TO_AFFECTS;
		af.aftype = AFT_INVIS;
		af.type = gsn_drowning;
		af.level = 60;
		af.duration = 5;
		af.tick_fun = drowning_tick;

		new_affect_to_char(ch, &af);

		act("You take a deep breath and hold it tight as you descend into the water.", ch, 0, 0, TO_CHAR);
		act("$n takes a deep breath as $e descends into the water.", ch, 0, 0, TO_ROOM);
	}
	else if (is_affected(ch, gsn_drowning)
		&& (to_room->sector_type != SECT_UNDERWATER || is_affected_room(to_room, gsn_airy_water)))
	{
		affect_strip(ch, gsn_drowning);
	}
}